

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

void dump_pref_file(_func_void_ang_file_ptr *dump,char *title,wchar_t row)

{
  _Bool _Var1;
  char *pcVar2;
  char *fmt;
  char ftmp [80];
  char buf [1024];
  char acStack_478 [80];
  char local_428 [1024];
  
  screen_save();
  prt("",row + L'\xffffffff',L'\0');
  pcVar2 = format("%s to a pref file",title);
  prt(pcVar2,row,L'\0');
  prt("",row + L'\x01',L'\0');
  prt("File: ",row + L'\x02',L'\0');
  prt("",row + L'\x03',L'\0');
  player_safe_name(acStack_478,0x50,player->full_name,true);
  my_strcat(acStack_478,".prf",0x50);
  if (arg_force_name == false) {
    _Var1 = askfor_aux(acStack_478,0x50,
                       (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
  }
  else {
    pcVar2 = format("Confirm writing to %s? ",acStack_478);
    _Var1 = get_check(pcVar2);
  }
  screen_load();
  if (_Var1 != false) {
    path_build(local_428,0x400,ANGBAND_DIR_USER,acStack_478);
    _Var1 = prefs_save(local_428,dump,title);
    pcVar2 = strchr(title,0x20);
    fmt = "Failed to save %s.";
    if (_Var1) {
      fmt = "Saved %s.";
    }
    msg(fmt,pcVar2 + 1);
    event_signal(EVENT_MESSAGE_FLUSH);
  }
  return;
}

Assistant:

static void dump_pref_file(void (*dump)(ang_file *), const char *title, int row)
{
	char buf[1024];

	/* Get filename from user */
	if (!get_pref_path(title, row, buf, sizeof(buf)))
		return;

	/* Try to save */
	if (prefs_save(buf, dump, title))
		msg("Saved %s.", strstr(title, " ") + 1);
	else
		msg("Failed to save %s.", strstr(title, " ") + 1);

	event_signal(EVENT_MESSAGE_FLUSH);

	return;
}